

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.h
# Opt level: O0

uint __thiscall
covenant::DFA_impl::
StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::insert
          (StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
           *this,set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *es,
          bool accept,uint base)

{
  bool bVar1;
  size_type sVar2;
  _Base_ptr p_Var3;
  value_type *pvVar4;
  int *piVar5;
  iterator k;
  reference puVar6;
  uint *puVar7;
  uint in_ECX;
  byte in_DL;
  _Rb_tree_const_iterator<unsigned_int> *in_RDI;
  iterator et_1;
  iterator it_2;
  uint ii_1;
  StateEntry *entry;
  iterator it;
  iterator et;
  iterator it_1;
  uint ii;
  undefined4 in_stack_ffffffffffffff78;
  uint uVar8;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff88;
  _Self in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar9;
  iterator<boost::unordered::detail::ptr_node<std::pair<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
  local_50;
  iterator<boost::unordered::detail::ptr_node<std::pair<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
  local_48;
  iterator<boost::unordered::detail::ptr_node<std::pair<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
  local_40;
  _Self local_38;
  _Self local_30;
  int local_24;
  uint local_20;
  byte local_19;
  uint local_4;
  
  local_19 = in_DL & 1;
  iVar9 = *(int *)&in_RDI->_M_node;
  local_20 = in_ECX;
  sVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     0x200c67);
  if (iVar9 < (int)sVar2) {
    while( true ) {
      in_stack_ffffffffffffff7c = *(int *)&in_RDI->_M_node;
      sVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)0x200c89);
      if ((int)sVar2 <= in_stack_ffffffffffffff7c) break;
      *(int *)&in_RDI->_M_node = *(int *)&in_RDI->_M_node << 1;
    }
    p_Var3 = (_Base_ptr)realloc(in_RDI[1]._M_node,(long)(*(int *)&in_RDI->_M_node << 1) * 4 + 8);
    in_RDI[1]._M_node = p_Var3;
  }
  sVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     0x200cd4);
  (in_RDI[1]._M_node)->_M_color = (int)sVar2 + _S_black;
  *(uint *)&(in_RDI[1]._M_node)->field_0x4 = (uint)(local_19 & 1);
  local_24 = 0;
  local_30._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_38._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                 ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  while (bVar1 = std::operator!=(&local_30,&local_38), bVar1) {
    puVar6 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                       ((_Rb_tree_const_iterator<unsigned_int> *)0x200d3e);
    *(uint *)(&(in_RDI[1]._M_node)->field_0x4 + (ulong)(local_24 + 1) * 4) = *puVar6;
    local_24 = local_24 + 1;
    std::_Rb_tree_const_iterator<unsigned_int>::operator++(in_RDI);
  }
  local_40.node_ =
       (node_pointer)
       boost::unordered::
       unordered_map<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*,_int,_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::HashEntry,_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::EqEntry,_std::allocator<std::pair<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
       ::find((unordered_map<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*,_int,_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::HashEntry,_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::EqEntry,_std::allocator<std::pair<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
               *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),(key_type *)0x200d85)
  ;
  local_48.node_ =
       (node_pointer)
       boost::unordered::
       unordered_map<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*,_int,_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::HashEntry,_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::EqEntry,_std::allocator<std::pair<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
       ::end((unordered_map<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*,_int,_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::HashEntry,_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::EqEntry,_std::allocator<std::pair<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
              *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  bVar1 = boost::unordered::iterator_detail::
          iterator<boost::unordered::detail::ptr_node<std::pair<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
          ::operator!=(&local_40,&local_48);
  if (bVar1) {
    pvVar4 = boost::unordered::iterator_detail::
             iterator<boost::unordered::detail::ptr_node<std::pair<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
             ::operator*((iterator<boost::unordered::detail::ptr_node<std::pair<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
                          *)0x200dbc);
    local_4 = pvVar4->second;
  }
  else {
    local_50.node_ =
         (node_pointer)
         boost::unordered::
         unordered_map<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*,_int,_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::HashEntry,_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::EqEntry,_std::allocator<std::pair<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
         ::end((unordered_map<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*,_int,_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::HashEntry,_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::EqEntry,_std::allocator<std::pair<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
                *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    bVar1 = boost::unordered::iterator_detail::
            iterator<boost::unordered::detail::ptr_node<std::pair<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
            ::operator!=(&local_40,&local_50);
    if (bVar1) {
      pvVar4 = boost::unordered::iterator_detail::
               iterator<boost::unordered::detail::ptr_node<std::pair<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
               ::operator*((iterator<boost::unordered::detail::ptr_node<std::pair<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
                            *)0x200dfd);
      local_4 = pvVar4->second;
    }
    else {
      sVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)0x200e16);
      piVar5 = (int *)malloc(sVar2 * 8 + 8);
      std::
      vector<covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*,_std::allocator<covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*>_>
      ::push_back((vector<covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*,_std::allocator<covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*>_>
                   *)in_stack_ffffffffffffff90._M_node,
                  (value_type *)CONCAT44(iVar9,in_stack_ffffffffffffff88));
      sVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)0x200e4b);
      *piVar5 = (int)sVar2 + 1;
      piVar5[1] = (uint)(local_19 & 1);
      iVar9 = 0;
      k = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      while (bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff98,
                                     (_Self *)&stack0xffffffffffffff90), bVar1) {
        puVar6 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                           ((_Rb_tree_const_iterator<unsigned_int> *)0x200eae);
        piVar5[(ulong)(iVar9 + 1) + 1] = *puVar6;
        iVar9 = iVar9 + 1;
        std::_Rb_tree_const_iterator<unsigned_int>::operator++(in_RDI);
      }
      uVar8 = local_20;
      puVar7 = (uint *)boost::unordered::
                       unordered_map<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*,_int,_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::HashEntry,_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::EqEntry,_std::allocator<std::pair<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
                       ::operator[]((unordered_map<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*,_int,_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::HashEntry,_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::EqEntry,_std::allocator<std::pair<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>_>
                                     *)CONCAT44(iVar9,in_stack_ffffffffffffffa0),
                                    (key_type *)k._M_node);
      *puVar7 = uVar8;
      local_4 = local_20;
    }
  }
  return local_4;
}

Assistant:

unsigned int insert(Container & es, bool accept, unsigned int base){
         // Ensure there is enough space in temp for the edges
         if(tempsz < (int) es.size())
         {
           while(tempsz < (int) es.size())
           {
             tempsz *= 2;
           }
           temp = ((StateEntry*) realloc(temp, sizeof(StateEntry) + 
                                         (2*tempsz)*sizeof(unsigned int)));
         }
         // Load the edges into temp.
         temp->sz = es.size() + 1;
         temp->data[0] = accept;
         unsigned int ii=0;
         for(typename Container::iterator it = es.begin(), et = es.end(); it!=et; ++it)
         {
           temp->data[ii+1] = *it;
           ii++;
         }
         
         // Look for the temporary element in the map.
         typename StateCache::iterator it(cache.find(temp));
         if(it != cache.end())
           return (*it).second;
         // Look for the temporary element in the map.
         if(it != cache.end())
           return (*it).second;
         else 
         {
           StateEntry* entry = ((StateEntry*) malloc(sizeof(StateEntry) + 
                                                     (2*es.size())*sizeof(unsigned int))); 
           entries.push_back(entry);
           entry->sz = es.size() + 1; 
           entry->data[0] = accept;
           unsigned int ii=0;
           for(typename Container::iterator it = es.begin(), et = es.end(); it!=et; ++it)
           {
             entry->data[ii+1] = *it;
             ii++;
           }
           cache[entry] = base;
           return base;
         }
       }